

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DatePartBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  function_statistics_t p_Var1;
  pointer pcVar2;
  ulong uVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  DatePartSpecifier DVar6;
  byte bVar7;
  int iVar8;
  reference pvVar9;
  pointer pEVar10;
  type expr;
  undefined **ppuVar11;
  BinderException *pBVar12;
  undefined **ppuVar13;
  string part_name;
  Value part_value;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  Value local_70;
  
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar9);
  iVar8 = (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[6])(pEVar10);
  if ((char)iVar8 != '\0') {
LAB_01ad19d9:
    *(undefined8 *)this = 0;
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar9);
  iVar8 = (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar10);
  if ((char)iVar8 == '\0') goto LAB_01ad19d9;
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   (pvVar9);
  ExpressionExecutor::EvaluateScalar(&local_70,context,expr,false);
  Value::ToString_abi_cxx11_(&local_90,&local_70);
  DVar6 = GetDatePartSpecifier(&local_90);
  if (DVar6 == BEGIN_DOUBLE) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::_M_erase(&arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ,(arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_erase
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,
               (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start);
    ::std::__cxx11::string::_M_replace
              ((ulong)&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name,0,
               (char *)(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name._M_string_length,0x1ed7da7);
    LogicalType::LogicalType((LogicalType *)&local_f0,DOUBLE);
    (bound_function->super_BaseScalarFunction).return_type.id_ =
         (LogicalTypeId)local_f0._M_dataplus._M_p;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
         local_f0._M_dataplus._M_p._1_1_;
    peVar4 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var5 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f0._M_string_length;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0.field_2._M_allocated_capacity;
    local_f0._M_string_length = (size_type)peVar4;
    local_f0.field_2._M_allocated_capacity = (size_type)p_Var5;
    LogicalType::~LogicalType((LogicalType *)&local_f0);
    pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar9);
    bVar7 = (pEVar10->return_type).id_ - DATE;
    if ((0x13 < bVar7) || ((0x8103fU >> (bVar7 & 0x1f) & 1) == 0)) {
      pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"%s can only take temporal arguments","");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar2 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
               _M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar2,
                 pcVar2 + (bound_function->super_BaseScalarFunction).super_SimpleFunction.
                          super_Function.name._M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar12,&local_f0,&local_d0);
      __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar3 = (ulong)bVar7;
    ppuVar11 = &PTR_UnaryFunction<duckdb::date_t,double,duckdb::DatePart::EpochOperator>_0247a1d0 +
               uVar3;
    ppuVar13 = &PTR_PropagateStatistics<duckdb::date_t>_0247a270;
  }
  else {
    if (DVar6 != JULIAN_DAY) goto LAB_01ad1ab9;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::_M_erase(&arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ,(arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_erase
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,
               (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start);
    ::std::__cxx11::string::_M_replace
              ((ulong)&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name,0,
               (char *)(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name._M_string_length,0x1dd2b97);
    LogicalType::LogicalType((LogicalType *)&local_f0,DOUBLE);
    (bound_function->super_BaseScalarFunction).return_type.id_ =
         (LogicalTypeId)local_f0._M_dataplus._M_p;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
         local_f0._M_dataplus._M_p._1_1_;
    peVar4 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var5 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f0._M_string_length;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0.field_2._M_allocated_capacity;
    local_f0._M_string_length = (size_type)peVar4;
    local_f0.field_2._M_allocated_capacity = (size_type)p_Var5;
    LogicalType::~LogicalType((LogicalType *)&local_f0);
    pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar9);
    bVar7 = (pEVar10->return_type).id_ - DATE;
    if ((5 < bVar7) || ((0x3dU >> (bVar7 & 0x1f) & 1) == 0)) {
      pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"%s can only take DATE or TIMESTAMP arguments","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar2 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
               _M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,
                 pcVar2 + (bound_function->super_BaseScalarFunction).super_SimpleFunction.
                          super_Function.name._M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar12,&local_f0,&local_b0);
      __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar3 = (ulong)bVar7;
    ppuVar11 = &
               PTR_UnaryFunction<duckdb::date_t,double,duckdb::DatePart::JulianDayOperator>_0247a170
               + uVar3;
    ppuVar13 = &PTR_PropagateStatistics<duckdb::date_t>_0247a1a0;
  }
  p_Var1 = (function_statistics_t)ppuVar13[uVar3];
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             &bound_function->function,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)*ppuVar11);
  bound_function->statistics = p_Var1;
LAB_01ad1ab9:
  *(undefined8 *)this = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  Value::~Value(&local_70);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> DatePartBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments) {
	//	If we are only looking for Julian Days for timestamps,
	//	then return doubles.
	if (arguments[0]->HasParameter() || !arguments[0]->IsFoldable()) {
		return nullptr;
	}

	Value part_value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	const auto part_name = part_value.ToString();
	switch (GetDatePartSpecifier(part_name)) {
	case DatePartSpecifier::JULIAN_DAY:
		arguments.erase(arguments.begin());
		bound_function.arguments.erase(bound_function.arguments.begin());
		bound_function.name = "julian";
		bound_function.return_type = LogicalType::DOUBLE;
		switch (arguments[0]->return_type.id()) {
		case LogicalType::TIMESTAMP:
		case LogicalType::TIMESTAMP_S:
		case LogicalType::TIMESTAMP_MS:
		case LogicalType::TIMESTAMP_NS:
			bound_function.function = DatePart::UnaryFunction<timestamp_t, double, DatePart::JulianDayOperator>;
			bound_function.statistics = DatePart::JulianDayOperator::template PropagateStatistics<timestamp_t>;
			break;
		case LogicalType::DATE:
			bound_function.function = DatePart::UnaryFunction<date_t, double, DatePart::JulianDayOperator>;
			bound_function.statistics = DatePart::JulianDayOperator::template PropagateStatistics<date_t>;
			break;
		default:
			throw BinderException("%s can only take DATE or TIMESTAMP arguments", bound_function.name);
		}
		break;
	case DatePartSpecifier::EPOCH:
		arguments.erase(arguments.begin());
		bound_function.arguments.erase(bound_function.arguments.begin());
		bound_function.name = "epoch";
		bound_function.return_type = LogicalType::DOUBLE;
		switch (arguments[0]->return_type.id()) {
		case LogicalType::TIMESTAMP:
		case LogicalType::TIMESTAMP_S:
		case LogicalType::TIMESTAMP_MS:
		case LogicalType::TIMESTAMP_NS:
			bound_function.function = DatePart::UnaryFunction<timestamp_t, double, DatePart::EpochOperator>;
			bound_function.statistics = DatePart::EpochOperator::template PropagateStatistics<timestamp_t>;
			break;
		case LogicalType::DATE:
			bound_function.function = DatePart::UnaryFunction<date_t, double, DatePart::EpochOperator>;
			bound_function.statistics = DatePart::EpochOperator::template PropagateStatistics<date_t>;
			break;
		case LogicalType::INTERVAL:
			bound_function.function = DatePart::UnaryFunction<interval_t, double, DatePart::EpochOperator>;
			bound_function.statistics = DatePart::EpochOperator::template PropagateStatistics<interval_t>;
			break;
		case LogicalType::TIME:
			bound_function.function = DatePart::UnaryFunction<dtime_t, double, DatePart::EpochOperator>;
			bound_function.statistics = DatePart::EpochOperator::template PropagateStatistics<dtime_t>;
			break;
		case LogicalType::TIME_TZ:
			bound_function.function = DatePart::UnaryFunction<dtime_tz_t, double, DatePart::EpochOperator>;
			bound_function.statistics = DatePart::EpochOperator::template PropagateStatistics<dtime_tz_t>;
			break;
		default:
			throw BinderException("%s can only take temporal arguments", bound_function.name);
		}
		break;
	default:
		break;
	}

	return nullptr;
}